

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int add_file(int argc,char **argv)

{
  int iVar1;
  ulonglong uVar2;
  longlong lVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  FILE *pFVar7;
  char *pcVar8;
  
  uVar2 = strtoull(argv[2],(char **)0x0,10);
  lVar3 = strtoll(argv[3],(char **)0x0,10);
  pcVar8 = argv[1];
  iVar1 = strcmp(pcVar8,"/dev/stdin");
  if (iVar1 == 0) {
    lVar4 = zip_source_filep(za,_stdin,uVar2,lVar3);
    pFVar7 = _stderr;
    if (lVar4 == 0) {
      uVar5 = zip_strerror(za);
      pcVar8 = "can\'t create zip_source from stdin: %s\n";
      goto LAB_00103789;
    }
  }
  else {
    lVar4 = zip_source_file(za,pcVar8,uVar2,lVar3);
    pFVar7 = _stderr;
    if (lVar4 == 0) {
      uVar5 = zip_strerror(za);
      pcVar8 = "can\'t create zip_source from file: %s\n";
LAB_00103789:
      fprintf(pFVar7,pcVar8,uVar5);
      return -1;
    }
  }
  lVar6 = zip_add(za,*argv,lVar4);
  if (lVar6 == -1) {
    zip_source_free(lVar4);
    pFVar7 = _stderr;
    pcVar8 = *argv;
    uVar5 = zip_strerror(za);
    fprintf(pFVar7,"can\'t add file \'%s\': %s\n",pcVar8,uVar5);
    return -1;
  }
  return 0;
}

Assistant:

static int
add_file(int argc, char *argv[]) {
    zip_source_t *zs;
    zip_uint64_t start = strtoull(argv[2], NULL, 10);
    zip_int64_t len = strtoll(argv[3], NULL, 10);

    if (strcmp(argv[1], "/dev/stdin") == 0) {
	if ((zs = zip_source_filep(za, stdin, start, len)) == NULL) {
	    fprintf(stderr, "can't create zip_source from stdin: %s\n", zip_strerror(za));
	    return -1;
	}
    }
    else {
	if ((zs = zip_source_file(za, argv[1], start, len)) == NULL) {
	    fprintf(stderr, "can't create zip_source from file: %s\n", zip_strerror(za));
	    return -1;
	}
    }

    if (zip_add(za, argv[0], zs) == -1) {
	zip_source_free(zs);
	fprintf(stderr, "can't add file '%s': %s\n", argv[0], zip_strerror(za));
	return -1;
    }
    return 0;
}